

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_move.cc
# Opt level: O1

string * __thiscall
hanabi_learning_env::HanabiMove::ToString_abi_cxx11_
          (string *__return_storage_ptr__,HanabiMove *this)

{
  long lVar1;
  char *pcVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  size_type *psVar6;
  uint uVar7;
  char *pcVar8;
  uint uVar9;
  uint uVar10;
  string __str;
  string __str_1;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  ulong local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  ulong local_68;
  long local_60;
  undefined8 uStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  switch(this->move_type_) {
  case kPlay:
    uVar10 = (uint)this->card_index_;
    uVar7 = -uVar10;
    if (0 < (int)uVar10) {
      uVar7 = uVar10;
    }
    uVar9 = 1;
    if (9 < uVar7) {
      uVar9 = 3 - (uVar7 < 100);
    }
    local_90 = &local_80;
    std::__cxx11::string::_M_construct((ulong)&local_90,(char)uVar9 - (this->card_index_ >> 7));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar10 >> 0x1f) + (long)local_90),uVar9,uVar7);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x11aa8c);
    local_b0 = &local_a0;
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_a0 = *plVar5;
      lStack_98 = plVar3[3];
    }
    else {
      local_a0 = *plVar5;
      local_b0 = (long *)*plVar3;
    }
    local_a8 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
    break;
  case kDiscard:
    uVar10 = (uint)this->card_index_;
    uVar7 = -uVar10;
    if (0 < (int)uVar10) {
      uVar7 = uVar10;
    }
    uVar9 = 1;
    if (9 < uVar7) {
      uVar9 = 3 - (uVar7 < 100);
    }
    local_90 = &local_80;
    std::__cxx11::string::_M_construct((ulong)&local_90,(char)uVar9 - (this->card_index_ >> 7));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar10 >> 0x1f) + (long)local_90),uVar9,uVar7);
    puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x11aa93);
    local_b0 = &local_a0;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_a0 = *plVar3;
      lStack_98 = puVar4[3];
    }
    else {
      local_a0 = *plVar3;
      local_b0 = (long *)*puVar4;
    }
    local_a8 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
    break;
  case kRevealColor:
    uVar10 = (uint)this->target_offset_;
    uVar7 = -uVar10;
    if (0 < (int)uVar10) {
      uVar7 = uVar10;
    }
    uVar9 = 1;
    if (9 < uVar7) {
      uVar9 = 3 - (uVar7 < 100);
    }
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar9 - (this->target_offset_ >> 7));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar10 >> 0x1f) + (long)local_50[0]),uVar9,uVar7);
    puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x11aa9d);
    local_70 = &local_60;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_60 = *plVar3;
      uStack_58 = puVar4[3];
    }
    else {
      local_60 = *plVar3;
      local_70 = (long *)*puVar4;
    }
    local_68 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
    local_90 = &local_80;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_80 = *plVar3;
      lStack_78 = puVar4[3];
    }
    else {
      local_80 = *plVar3;
      local_90 = (long *)*puVar4;
    }
    local_88 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    ColorIndexToChar((int)this->color_);
    puVar4 = (undefined8 *)std::__cxx11::string::_M_replace_aux((ulong)&local_90,local_88,0,'\x01');
    local_b0 = &local_a0;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_a0 = *plVar3;
      lStack_98 = puVar4[3];
    }
    else {
      local_a0 = *plVar3;
      local_b0 = (long *)*puVar4;
    }
    local_a8 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
    goto LAB_00114731;
  case kRevealRank:
    uVar10 = (uint)this->target_offset_;
    uVar7 = -uVar10;
    if (0 < (int)uVar10) {
      uVar7 = uVar10;
    }
    uVar9 = 1;
    if (9 < uVar7) {
      uVar9 = 3 - (uVar7 < 100);
    }
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar9 - (this->target_offset_ >> 7));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar10 >> 0x1f) + (long)local_50[0]),uVar9,uVar7);
    puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x11aa9d);
    local_70 = &local_60;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_60 = *plVar3;
      uStack_58 = puVar4[3];
    }
    else {
      local_60 = *plVar3;
      local_70 = (long *)*puVar4;
    }
    local_68 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
    local_90 = &local_80;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_80 = *plVar3;
      lStack_78 = puVar4[3];
    }
    else {
      local_80 = *plVar3;
      local_90 = (long *)*puVar4;
    }
    local_88 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    RankIndexToChar((int)this->rank_);
    puVar4 = (undefined8 *)std::__cxx11::string::_M_replace_aux((ulong)&local_90,local_88,0,'\x01');
    local_b0 = &local_a0;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_a0 = *plVar3;
      lStack_98 = puVar4[3];
    }
    else {
      local_a0 = *plVar3;
      local_b0 = (long *)*puVar4;
    }
    local_a8 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
LAB_00114731:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar6) {
      lVar1 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    plVar3 = local_50[0];
    if (local_50[0] == local_40) {
      return __return_storage_ptr__;
    }
    goto LAB_001145e3;
  case kDeal:
    if (this->color_ < '\0') {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "(Deal XX)";
      pcVar2 = "(Deal XX)";
      goto LAB_00114462;
    }
    local_70 = &local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"(Deal ","");
    ColorIndexToChar((int)this->color_);
    plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_70,local_68,0,'\x01');
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_80 = *plVar5;
      lStack_78 = plVar3[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar5;
      local_90 = (long *)*plVar3;
    }
    local_88 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    RankIndexToChar((int)this->rank_);
    puVar4 = (undefined8 *)std::__cxx11::string::_M_replace_aux((ulong)&local_90,local_88,0,'\x01');
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_a0 = *plVar3;
      lStack_98 = puVar4[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar3;
      local_b0 = (long *)*puVar4;
    }
    local_a8 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar6) {
      lVar1 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    plVar3 = local_70;
    if (local_70 == &local_60) {
      return __return_storage_ptr__;
    }
    goto LAB_001145e3;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "(INVALID)";
    pcVar2 = "(INVALID)";
LAB_00114462:
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar8,pcVar2 + 9);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar6) {
    lVar1 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  plVar3 = local_90;
  if (local_90 != &local_80) {
LAB_001145e3:
    operator_delete(plVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HanabiMove::ToString() const {
  switch (MoveType()) {
    case kPlay:
      return "(Play " + std::to_string(CardIndex()) + ")";
    case kDiscard:
      return "(Discard " + std::to_string(CardIndex()) + ")";
    case kRevealColor:
      return "(Reveal player +" + std::to_string(TargetOffset()) + " color " +
             ColorIndexToChar(Color()) + ")";
    case kRevealRank:
      return "(Reveal player +" + std::to_string(TargetOffset()) + " rank " +
             RankIndexToChar(Rank()) + ")";
    case kDeal:
      if (color_ >= 0) {
        return std::string("(Deal ") + ColorIndexToChar(Color()) +
               RankIndexToChar(Rank()) + ")";
      } else {
        return std::string("(Deal XX)");
      }
    default:
      return "(INVALID)";
  }
}